

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_Date_UTC(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  ulong uVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  anon_union_8_2_94730072 u;
  double dVar7;
  JSValue JVar8;
  JSValue val;
  double a;
  double fields [7];
  double local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  JVar3.float64 = NAN;
  local_48 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_38 = 0;
  local_58 = ZEXT816(0x3ff0000000000000);
  uVar2 = 7;
  if (argc != 0) {
    if (0 < argc) {
      iVar5 = 7;
      if ((uint)argc < 7) {
        iVar5 = argc;
      }
      uVar2 = 0;
      do {
        val.tag = *(int64_t *)((long)&argv->tag + uVar2 * 2);
        val.u.ptr = ((JSValueUnion *)((long)&argv->u + uVar2 * 2))->ptr;
        iVar1 = JS_ToFloat64(ctx,&local_70,val);
        if (iVar1 != 0) {
          uVar2 = 6;
          JVar3.float64 = 0.0;
          goto LAB_0014c677;
        }
        if (0x7fefffffffffffff < (ulong)ABS(local_70)) {
          uVar2 = 7;
          goto LAB_0014c677;
        }
        dVar7 = trunc(local_70);
        *(double *)(local_68 + uVar2) = dVar7;
        if (((uVar2 == 0) && (0.0 <= (double)local_68._0_8_)) && ((double)local_68._0_8_ < 100.0)) {
          local_68._0_8_ = (double)local_68._0_8_ + 1900.0;
        }
        uVar2 = uVar2 + 8;
      } while ((uint)(iVar5 << 3) != uVar2);
    }
    dVar7 = set_date_fields((double *)local_68,0);
    uVar4 = (ulong)dVar7 & 0xffffffff;
    uVar6 = (ulong)dVar7 & 0xffffffff00000000;
    if (dVar7 == (double)(int)dVar7) {
      uVar4 = (ulong)(uint)(int)dVar7;
      uVar6 = 0;
    }
    uVar2 = 7;
    if (dVar7 == (double)(int)dVar7) {
      uVar2 = 0;
    }
    JVar3.ptr = (void *)(uVar4 | uVar6);
  }
LAB_0014c677:
  JVar8.tag = uVar2;
  JVar8.u.float64 = JVar3.float64;
  return JVar8;
}

Assistant:

static JSValue js_Date_UTC(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    // UTC(y, mon, d, h, m, s, ms)
    double fields[] = { 0, 0, 1, 0, 0, 0, 0 };
    int i, n;
    double a;

    n = argc;
    if (n == 0)
        return JS_NAN;
    if (n > 7)
        n = 7;
    for(i = 0; i < n; i++) {
        if (JS_ToFloat64(ctx, &a, argv[i]))
            return JS_EXCEPTION;
        if (!isfinite(a))
            return JS_NAN;
        fields[i] = trunc(a);
        if (i == 0 && fields[0] >= 0 && fields[0] < 100)
            fields[0] += 1900;
    }
    return JS_NewFloat64(ctx, set_date_fields(fields, 0));
}